

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

int frame_worker_hook(void *arg1,void *arg2)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t **in_RDI;
  int result;
  size_t unaff_retaddr;
  uint8_t *data;
  FrameWorkerData *frame_worker_data;
  
  puVar1 = in_RDI[1];
  iVar2 = av1_receive_compressed_data((AV1Decoder *)data,unaff_retaddr,in_RDI);
  in_RDI[2] = puVar1;
  if (iVar2 != 0) {
    puVar1 = *in_RDI;
    puVar1[0x58d90] = '\x01';
    puVar1[0x58d91] = '\0';
    puVar1[0x58d92] = '\0';
    puVar1[0x58d93] = '\0';
  }
  return (int)((iVar2 != 0 ^ 0xffU) & 1);
}

Assistant:

static int frame_worker_hook(void *arg1, void *arg2) {
  FrameWorkerData *const frame_worker_data = (FrameWorkerData *)arg1;
  const uint8_t *data = frame_worker_data->data;
  (void)arg2;

  int result = av1_receive_compressed_data(frame_worker_data->pbi,
                                           frame_worker_data->data_size, &data);
  frame_worker_data->data_end = data;

  if (result != 0) {
    // Check decode result in serial decode.
    frame_worker_data->pbi->need_resync = 1;
  }
  return !result;
}